

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ScopeData * __thiscall
ExpressionContext::GlobalScopeFrom(ExpressionContext *this,ScopeData *scopeData)

{
  ScopeData *scopeData_local;
  ExpressionContext *this_local;
  
  if (scopeData == (ScopeData *)0x0) {
    this_local = (ExpressionContext *)0x0;
  }
  else if (scopeData->type == SCOPE_TEMPORARY) {
    this_local = (ExpressionContext *)0x0;
  }
  else if (scopeData->ownerFunction == (FunctionData *)0x0) {
    if (scopeData->ownerType == (TypeBase *)0x0) {
      this_local = (ExpressionContext *)scopeData;
      if (scopeData->scope != (ScopeData *)0x0) {
        this_local = (ExpressionContext *)GlobalScopeFrom(this,scopeData->scope);
      }
    }
    else {
      this_local = (ExpressionContext *)0x0;
    }
  }
  else {
    this_local = (ExpressionContext *)0x0;
  }
  return (ScopeData *)this_local;
}

Assistant:

ScopeData* ExpressionContext::GlobalScopeFrom(ScopeData *scopeData)
{
	if(!scopeData)
		return NULL;

	if(scopeData->type == SCOPE_TEMPORARY)
		return NULL;

	if(scopeData->ownerFunction)
		return NULL;

	if(scopeData->ownerType)
		return NULL;

	if(scopeData->scope)
		return GlobalScopeFrom(scopeData->scope);

	return scopeData;
}